

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

int linb::any::vtable_dynamic<ModelAnnotation>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  ModelAnnotation *this;
  
  this = (ModelAnnotation *)operator_new(0x18);
  ModelAnnotation::ModelAnnotation(this,*(ModelAnnotation **)dst);
  *(ModelAnnotation **)src = this;
  return extraout_EAX;
}

Assistant:

static void copy(const storage_union& src, storage_union& dest)
        {
            dest.dynamic = new T(*reinterpret_cast<const T*>(src.dynamic));
        }